

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_factory.h
# Opt level: O0

string * __thiscall
linux_util::canvas_factory<(linux_util::screen_t)0>::variable_info_abi_cxx11_
          (canvas_factory<(linux_util::screen_t)0> *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  void *in_stack_fffffffffffffdb0;
  request_t in_stack_fffffffffffffdb8;
  device *in_stack_fffffffffffffdc0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  device::xioctl(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"\nxres\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0xac));
  poVar1 = std::operator<<(poVar1,"\nyres\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0xb0));
  poVar1 = std::operator<<(poVar1,"\nxres_virtual\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0xb4));
  poVar1 = std::operator<<(poVar1,"\nyres_virtual\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0xb8));
  poVar1 = std::operator<<(poVar1,"\nxoffset\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0xbc));
  poVar1 = std::operator<<(poVar1,"\nyoffset\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0xc0));
  poVar1 = std::operator<<(poVar1,"\nbits_per_pixel\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0xc4));
  poVar1 = std::operator<<(poVar1,"\nr shift\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0xcc));
  poVar1 = std::operator<<(poVar1,"\ng shift\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0xd8));
  poVar1 = std::operator<<(poVar1,"\nb shift\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0xe4));
  poVar1 = std::operator<<(poVar1,"\nt shift\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0xf0));
  poVar1 = std::operator<<(poVar1,"\ngrayscale\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 200));
  poVar1 = std::operator<<(poVar1,"\nnonstd\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0xfc));
  poVar1 = std::operator<<(poVar1,"\nactivate\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0x100));
  poVar1 = std::operator<<(poVar1,"\nheight\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0x104));
  poVar1 = std::operator<<(poVar1,"mm");
  poVar1 = std::operator<<(poVar1,"\nwidth\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0x108));
  std::operator<<(poVar1,"mm\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string variable_info()  {
            xioctl(FBIOGET_VSCREENINFO, &vinfo); // acquire variable info
            std::stringstream ss;
            ss  << "\nxres\t\t" << vinfo.xres           // visible resolution
                << "\nyres\t\t" << vinfo.yres
                << "\nxres_virtual\t" << vinfo.xres_virtual // virtual resolution
                << "\nyres_virtual\t" << vinfo.yres_virtual
                << "\nxoffset\t\t" << vinfo.xoffset     // offsets from virtual to visible resolution
                << "\nyoffset\t\t" << vinfo.yoffset
                << "\nbits_per_pixel\t" << vinfo.bits_per_pixel
                << "\nr shift\t\t" << vinfo.red.offset
                << "\ng shift\t\t" << vinfo.green.offset
                << "\nb shift\t\t" << vinfo.blue.offset
                << "\nt shift\t\t" << vinfo.transp.offset
                << "\ngrayscale\t" << vinfo.grayscale   // 0 = color, 1 = grayscale, >1 = FOURCC
                << "\nnonstd\t\t" << vinfo.nonstd       // != 0 non standard pixel format
                << "\nactivate\t" << vinfo.activate     // e.g FB_ACTIVATE_NOW set values immediately (or vbl), FB_ACTIVATE_FORCE force apply even when no change
                << "\nheight\t\t" << vinfo.height << "mm"   // height of picture in mm
                << "\nwidth\t\t" << vinfo.width << "mm\n";  // width of picture in mm
            return ss.str();
        }